

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O1

Entry * __thiscall
TTD::TTDIdentifierDictionary<unsigned_long,_Js::Type_*>::FindSlotForId<false>
          (TTDIdentifierDictionary<unsigned_long,_Js::Type_*> *this,unsigned_long id)

{
  Entry *pEVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Entry *pEVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  
  uVar6 = CONCAT44(0,this->m_h1Prime);
  if (((uVar6 != 0) && (uVar10 = (ulong)this->m_h2Prime, uVar10 != 0)) &&
     (pEVar1 = this->m_hashArray, pEVar1 != (Entry *)0x0)) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar6;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = id;
    lVar8 = SUB168(auVar3 % auVar2,0);
    if (pEVar1[lVar8].Key == id) {
      pEVar4 = pEVar1 + lVar8;
    }
    else {
      pEVar4 = (Entry *)(id / uVar10);
      uVar5 = this->m_capacity - 1;
      uVar7 = (int)(id % uVar10) + SUB164(auVar3 % auVar2,0) & uVar5;
      uVar9 = uVar7;
      do {
        uVar6 = (ulong)uVar9;
        if (pEVar1[uVar6].Key == id) {
          pEVar4 = pEVar1 + uVar9;
        }
        else {
          uVar9 = uVar9 + 1 & uVar5;
          if (uVar9 == uVar7) {
            TTDAbort_unrecoverable_error("The key is not here (or we messed up).");
          }
        }
      } while (pEVar1[uVar6].Key != id);
    }
    return pEVar4;
  }
  TTDAbort_unrecoverable_error("Not valid!!");
}

Assistant:

Entry* FindSlotForId(Tag id) const
        {
            TTDAssert(this->m_h1Prime != 0 && this->m_h2Prime != 0, "Not valid!!");
            TTDAssert(this->m_hashArray != nullptr, "Not valid!!");

            Tag searchKey = findEmpty ? 0 : id;

            //h1Prime is less than table size by construction so we dont need to re-index
            uint32 primaryIndex = TTD_DICTIONARY_HASH(id, this->m_h1Prime);
            if (this->m_hashArray[primaryIndex].Key == searchKey)
            {
                return (this->m_hashArray + primaryIndex);
            }

            //do a hash for the second offset to avoid clustering and then do linear probing
            uint32 offset = TTD_DICTIONARY_HASH(id, this->m_h2Prime);
            uint32 probeIndex = TTD_DICTIONARY_INDEX(primaryIndex + offset, this->m_capacity);
            while (true)
            {
                Entry* curr = (this->m_hashArray + probeIndex);
                if (curr->Key == searchKey)
                {
                    return curr;
                }
                probeIndex = TTD_DICTIONARY_INDEX(probeIndex + 1, this->m_capacity);

                TTDAssert(probeIndex != TTD_DICTIONARY_INDEX(primaryIndex + offset, this->m_capacity), "The key is not here (or we messed up).");
            }
        }